

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
::raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
               *this,raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
                     *that,allocator_type *a)

{
  undefined1 auVar1 [16];
  ctrl_t cVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 *puVar5;
  ushort uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ctrl_t *pcVar9;
  ulong uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
  *ppVar12;
  undefined1 (*pauVar13) [16];
  uint64_t v;
  uint64_t v_1;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  FindInfo FVar19;
  iterator iter;
  iterator iter_00;
  long local_68;
  
  AssertNotDebugCapacity(that);
  uVar10 = (that->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           size_ >> 1;
  raw_hash_set(this,(long)(uVar10 - 1) / 7 + uVar10,(hasher *)that,(key_equal *)that,a);
  AssertNotDebugCapacity(that);
  AssertNotDebugCapacity(that);
  uVar10 = (that->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           size_;
  if (1 < uVar10) {
    uVar15 = uVar10 >> 1;
    uVar3 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    uVar11 = (ulong)(this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc | 1;
    local_68 = *(long *)((long)&(that->settings_).
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8);
    uVar16 = (that->settings_).
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    pauVar13 = (undefined1 (*) [16])
               (that->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
    uVar8 = uVar3;
    uVar17 = uVar15;
    if (uVar16 < 0xf) {
      if (8 < uVar16) {
        __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x78b,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                     );
      }
      uVar16 = *(ulong *)(*pauVar13 + uVar16) & 0x8080808080808080;
      if (uVar16 != 0x8080808080808080) {
        uVar16 = uVar16 ^ 0x8080808080808080;
        do {
          uVar14 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          uVar14 = uVar14 >> 3 & 0x1fffffff;
          ppVar12 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
                     *)((ulong)(uint)((int)uVar14 * 0x60) + local_68 + -0x60);
          if (uVar3 < 0x11) {
            uVar8 = uVar8 + uVar11 & uVar3;
          }
          else {
            uVar8 = (ppVar12->first)._M_string_length;
            uVar7 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,
                               (ppVar12->first)._M_dataplus._M_p,uVar8);
            uVar8 = (uVar7 ^ uVar8) * -0x234dd359734ecb13;
            FVar19 = find_first_non_full_outofline
                               ((CommonFields *)this,
                                uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                                (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
            uVar8 = FVar19.offset;
            if (((this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.size_ & 1) != 0) {
              CommonFields::backing_array_start((CommonFields *)this);
            }
          }
          cVar2 = pauVar13[-1][uVar14 + 0xf];
          uVar14 = (ppVar12->first)._M_string_length;
          uVar7 = hash_internal::MixingHashState::CombineContiguousImpl
                            (&hash_internal::MixingHashState::kSeed,
                             (ppVar12->first)._M_dataplus._M_p,uVar14);
          if (((ctrl_t)((uVar7 ^ uVar14) * 0x5cb22ca68cb134ed >> 0x38) & ~kEmpty) != cVar2) {
LAB_00b1ba35:
            __assert_fail("(H2(PolicyTraits::apply(HashElement{hash_ref()}, PolicyTraits::element(that_slot))) == h2 && \"hash function value changed unexpectedly during the copy\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xb05,
                          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>>::raw_hash_set(const raw_hash_set<FlatHashMapPolicy<basic_string<char>, AnnotationRecord>, StringHash, StringEq, allocator<pair<const basic_string<char>, AnnotationRecord>>> &, const allocator_type &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>]"
                         );
          }
          uVar14 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
          if (uVar14 <= uVar8) {
LAB_00b1ba54:
            __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x744,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          pcVar9 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
          pcVar9[uVar8] = cVar2;
          pcVar9[(ulong)((uint)uVar14 & 0xf) + (uVar8 - 0xf & uVar14)] = cVar2;
          pcVar9 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
          if (pcVar9 == (ctrl_t *)0x0) {
LAB_00b1ba73:
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>]"
                         );
          }
          iter.ctrl_ = pcVar9 + uVar8;
          iter.field_1.slot_ =
               (slot_type *)
               (uVar8 * 0x60 +
               (long)(this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.slot_array.p);
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
          ::
          emplace_at<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
                      *)this,iter,ppVar12);
          uVar16 = uVar16 & uVar16 - 1;
        } while (uVar16 != 0);
      }
    }
    else {
      while( true ) {
        auVar1 = *pauVar13;
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
        if (uVar18 != 0xffff) {
          uVar18 = ~uVar18;
          do {
            uVar4 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            if ((char)(*pauVar13)[uVar4] < '\0') {
              __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x79d,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                           );
            }
            ppVar12 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
                       *)((ulong)(uVar4 * 0x60) + local_68);
            if (uVar3 < 0x11) {
              uVar8 = uVar8 + uVar11 & uVar3;
            }
            else {
              uVar16 = (ppVar12->first)._M_string_length;
              uVar7 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,
                                 (ppVar12->first)._M_dataplus._M_p,uVar16);
              uVar16 = (uVar7 ^ uVar16) * -0x234dd359734ecb13;
              FVar19 = find_first_non_full_outofline
                                 ((CommonFields *)this,
                                  uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
              uVar8 = FVar19.offset;
              if (((this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_ & 1) != 0) {
                CommonFields::backing_array_start((CommonFields *)this);
              }
            }
            cVar2 = (*pauVar13)[uVar4];
            uVar16 = (ppVar12->first)._M_string_length;
            uVar7 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,
                               (ppVar12->first)._M_dataplus._M_p,uVar16);
            if (((ctrl_t)((uVar7 ^ uVar16) * 0x5cb22ca68cb134ed >> 0x38) & ~kEmpty) != cVar2)
            goto LAB_00b1ba35;
            uVar16 = (this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
            if (uVar16 <= uVar8) goto LAB_00b1ba54;
            pcVar9 = (this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.control;
            pcVar9[uVar8] = cVar2;
            pcVar9[(ulong)((uint)uVar16 & 0xf) + (uVar8 - 0xf & uVar16)] = cVar2;
            pcVar9 = (this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.control;
            if (pcVar9 == (ctrl_t *)0x0) goto LAB_00b1ba73;
            iter_00.ctrl_ = pcVar9 + uVar8;
            iter_00.field_1.slot_ =
                 (slot_type *)
                 (uVar8 * 0x60 +
                 (long)(this->settings_).
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.slot_array.p);
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
            ::
            emplace_at<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
                        *)this,iter_00,ppVar12);
            uVar17 = uVar17 - ~kDeleted;
            uVar6 = (ushort)(uVar18 - 1) & (ushort)uVar18;
            uVar18 = CONCAT22((short)(uVar18 - 1 >> 0x10),uVar6);
          } while (uVar6 != 0);
        }
        if (uVar17 == ~kSentinel) break;
        local_68 = local_68 + 0x600;
        puVar5 = *pauVar13;
        pauVar13 = pauVar13 + 1;
        if (puVar5[0xf] == -1) {
          __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7a5,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                       );
        }
      }
      if ((ulong)uVar15 <
          (that->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_ >> 1) {
        __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7aa,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                     );
      }
    }
    if ((uVar3 < 0x11) &&
       (((this->settings_).
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_ & 1) != 0)) {
      CommonFields::backing_array_start((CommonFields *)this);
    }
    pcVar9 = (this->settings_).
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    (this->settings_).
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
         (ulong)((uint)(this->settings_).
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.size_ & 1) | uVar10 & 0xfffffffffffffffe;
    pcVar9 = pcVar9 + -8;
    if (((ulong)pcVar9 & 7) != 0) {
      __assert_fail("(reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0) && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x590,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
    }
    if ((ulong)(*(undefined8 *)pcVar9 & 0x7fffffffffffffff) < (ulong)uVar15) {
      __assert_fail("(GetGrowthLeft() >= cnt) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x46b,
                    "void absl::container_internal::GrowthInfo::OverwriteManyEmptyAsFull(size_t)");
    }
    *(undefined8 *)pcVar9 = *(undefined8 *)pcVar9 - uVar15;
  }
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
      : raw_hash_set(GrowthToLowerboundCapacity(that.size()), that.hash_ref(),
                     that.eq_ref(), a) {
    that.AssertNotDebugCapacity();
    const size_t size = that.size();
    if (size == 0) {
      return;
    }
    // We don't use `that.is_soo()` here because `that` can have non-SOO
    // capacity but have a size that fits into SOO capacity.
    if (fits_in_soo(size)) {
      ABSL_SWISSTABLE_ASSERT(size == 1);
      common().set_full_soo();
      emplace_at(soo_iterator(), *that.begin());
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) resize_with_soo_infoz(infoz);
      return;
    }
    ABSL_SWISSTABLE_ASSERT(!that.is_soo());
    const size_t cap = capacity();
    // Note about single group tables:
    // 1. It is correct to have any order of elements.
    // 2. Order has to be non deterministic.
    // 3. We are assigning elements with arbitrary `shift` starting from
    //    `capacity + shift` position.
    // 4. `shift` must be coprime with `capacity + 1` in order to be able to use
    //     modular arithmetic to traverse all positions, instead if cycling
    //     through a subset of positions. Odd numbers are coprime with any
    //     `capacity + 1` (2^N).
    size_t offset = cap;
    const size_t shift =
        is_single_group(cap) ? (PerTableSalt(control()) | 1) : 0;
    IterateOverFullSlots(
        that.common(), that.slot_array(),
        [&](const ctrl_t* that_ctrl,
            slot_type* that_slot) ABSL_ATTRIBUTE_ALWAYS_INLINE {
          if (shift == 0) {
            // Big tables case. Position must be searched via probing.
            // The table is guaranteed to be empty, so we can do faster than
            // a full `insert`.
            const size_t hash = PolicyTraits::apply(
                HashElement{hash_ref()}, PolicyTraits::element(that_slot));
            FindInfo target = find_first_non_full_outofline(common(), hash);
            infoz().RecordInsert(hash, target.probe_length);
            offset = target.offset;
          } else {
            // Small tables case. Next position is computed via shift.
            offset = (offset + shift) & cap;
          }
          const h2_t h2 = static_cast<h2_t>(*that_ctrl);
          ABSL_SWISSTABLE_ASSERT(  // We rely that hash is not changed for small
                                   // tables.
              H2(PolicyTraits::apply(HashElement{hash_ref()},
                                     PolicyTraits::element(that_slot))) == h2 &&
              "hash function value changed unexpectedly during the copy");
          SetCtrl(common(), offset, h2, sizeof(slot_type));
          emplace_at(iterator_at(offset), PolicyTraits::element(that_slot));
          common().maybe_increment_generation_on_insert();
        });
    if (shift != 0) {
      // On small table copy we do not record individual inserts.
      // RecordInsert requires hash, but it is unknown for small tables.
      infoz().RecordStorageChanged(size, cap);
    }
    common().set_size(size);
    growth_info().OverwriteManyEmptyAsFull(size);
  }